

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids)

{
  char cVar1;
  pointer pbVar2;
  string *aDomainName;
  _Alloc_hider *p_Var3;
  size_type sVar4;
  bool bVar5;
  Status SVar6;
  int iVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Interpreter *this_00;
  _Alloc_hider _Var10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar11;
  pointer pbVar12;
  bool bVar13;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  StringArray unresolved;
  Error error;
  string errorMessage;
  writer write;
  string local_198;
  undefined1 local_178 [8];
  char *pcStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  ErrorCode local_150;
  pointer local_148;
  pointer local_140;
  undefined1 local_138 [24];
  char *pcStack_120;
  ulong local_118;
  char local_110 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  code *local_100;
  writer local_f8 [3];
  Value *local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_d8;
  long local_d0;
  ulong local_c8;
  string local_c0;
  undefined1 local_a0 [32];
  ErrorCode local_80;
  pointer local_78;
  pointer local_70;
  undefined1 local_68 [56];
  
  local_150 = kNone;
  local_148 = (pointer)local_138;
  local_140 = (pointer)0x0;
  local_138._0_4_ = local_138._0_4_ & 0xffffff00;
  if ((this->mContext).mNwkAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mContext).mNwkAliases.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_138 + 0x10);
      local_138._16_8_ = local_138._16_8_ & 0xffffffff00000000;
      pcVar8 = "Either network or domain list must have entries for multi-network command";
      pcStack_120 = "Either network or domain list must have entries for multi-network command";
      local_118 = 0x49;
      local_110[0] = '\0';
      local_110[1] = '\0';
      local_110[2] = '\0';
      local_110[3] = '\0';
      local_110[4] = '\0';
      local_110[5] = '\0';
      local_110[6] = '\0';
      local_110[7] = '\0';
      local_100 = (code *)0x0;
      local_198._M_dataplus._M_p = (pointer)paVar9;
      local_108 = paVar9;
      do {
        cVar1 = *pcVar8;
        pcVar11 = pcVar8;
        while (cVar1 != '{') {
          pcVar11 = pcVar11 + 1;
          if (pcVar11 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()((writer *)&local_198,pcVar8,"");
            goto LAB_0024d060;
          }
          cVar1 = *pcVar11;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()((writer *)&local_198,pcVar8,pcVar11);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar11,"",(format_string_checker<char> *)paVar9);
      } while (pcVar8 != "");
LAB_0024d060:
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)(local_138 + 0x10);
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_178,
                 (v10 *)"Either network or domain list must have entries for multi-network command",
                 (string_view)ZEXT816(0x49),args_02);
      local_68._16_4_ = 2;
      local_68._24_8_ = (pointer)(local_68 + 0x28);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_68 + 0x18),local_178,pcStack_170 + (long)local_178);
      if ((pointer)local_68._24_8_ != (pointer)(local_68 + 0x28)) {
        operator_delete((void *)local_68._24_8_);
      }
LAB_0024d0c4:
      paVar9 = &local_168;
LAB_0024d0c9:
      _Var10._M_p = *(pointer *)(paVar9->_M_local_buf + -0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p == paVar9) goto LAB_0024d214;
      goto LAB_0024d20f;
    }
    bVar13 = IsFeatureSupported((Interpreter *)__return_storage_ptr__,mMultiNetworkSyntax_abi_cxx11_
                                ,aExpr);
    if (!bVar13) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_138 + 0x10);
      local_138._16_4_ = 0xc;
      pcVar8 = "\'{}\' is not supported by the command";
      pcStack_120 = "\'{}\' is not supported by the command";
      local_118 = 0x24;
      local_110[0] = '\0';
      local_110[1] = '\0';
      local_110[2] = '\0';
      local_110[3] = '\0';
      local_110[4] = '\x01';
      local_110[5] = '\0';
      local_110[6] = '\0';
      local_110[7] = '\0';
      local_100 = ::fmt::v10::detail::
                  parse_format_specs<char[6],fmt::v10::detail::compile_parse_context<char>>;
      local_108 = paVar9;
      local_f8[0].handler_ = (format_string_checker<char> *)paVar9;
      do {
        cVar1 = *pcVar8;
        pcVar11 = pcVar8;
        while (cVar1 != '{') {
          pcVar11 = pcVar11 + 1;
          if (pcVar11 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>
            ::writer::operator()((writer *)local_f8,pcVar8,"");
            goto LAB_0024d183;
          }
          cVar1 = *pcVar11;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>::
        writer::operator()((writer *)local_f8,pcVar8,pcVar11);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[6]>&>
                           (pcVar11,"",(format_string_checker<char> *)paVar9);
      } while (pcVar8 != "");
LAB_0024d183:
      local_138._16_8_ = (long)"start --dom" + 6;
      args_03.field_1.args_ = in_R9.args_;
      args_03.desc_ = (unsigned_long_long)(local_138 + 0x10);
      fmt_00.size_ = 0xc;
      fmt_00.data_ = (char *)0x24;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_198,(v10 *)"\'{}\' is not supported by the command",fmt_00,args_03);
      local_178._0_4_ = 2;
      pcStack_170 = local_168._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pcStack_170,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
      goto LAB_0024d1d5;
    }
    if ((this->mContext).mNwkAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->mContext).mNwkAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      aDomainName = (this->mContext).mDomAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->mContext).mDomAliases.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)aDomainName) < 0x21) {
        SVar6 = persistent_storage::Registry::GetNetworkXpansInDomain
                          ((this->mRegistry).
                           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,aDomainName,aNids);
        if (SVar6 == kSuccess) goto LAB_0024d57c;
        if (SVar6 == kNotFound) {
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          pbVar12 = (this->mContext).mDomAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_198._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
          local_198._M_string_length = pbVar12->_M_string_length;
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)&local_198;
          fmt_01.size_ = 0xd;
          fmt_01.data_ = (char *)0x15;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_178,(v10 *)"domain \'{}\' not found",fmt_01,args_05);
          local_138._16_4_ = 0x12;
          pcStack_120 = local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pcStack_120,local_178,pcStack_170 + (long)local_178);
        }
        else {
          ::fmt::v10::detail::
          check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_FMT_COMPILE_STRING,_0>
                    ();
          pbVar12 = (this->mContext).mDomAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_178 = (undefined1  [8])(pbVar12->_M_dataplus)._M_p;
          pcStack_170 = (char *)pbVar12->_M_string_length;
          local_168._M_allocated_capacity = (size_type)SVar6;
          args_10.field_1.values_ = in_R9.values_;
          args_10.desc_ = (unsigned_long_long)local_178;
          fmt_03.size_ = 0x1d;
          fmt_03.data_ = (char *)0x2c;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_198,(v10 *)"domain \'{}\' failed to resolve with status={}",fmt_03,
                     args_10);
          local_138._16_4_ = 0x12;
          pcStack_120 = local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pcStack_120,local_198._M_dataplus._M_p,
                     local_198._M_dataplus._M_p + local_198._M_string_length);
        }
        local_150 = local_138._16_4_;
        std::__cxx11::string::operator=((string *)&local_148,(string *)&pcStack_120);
        if (pcStack_120 != local_110) {
          operator_delete(pcStack_120);
        }
        if (SVar6 == kNotFound) goto LAB_0024d0c4;
        paVar9 = &local_198.field_2;
        goto LAB_0024d0c9;
      }
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_138 + 0x10);
      local_138._16_8_ = (ulong)(uint)local_138._20_4_ << 0x20;
      pcVar8 = "multiple domain specification not allowed";
      pcStack_120 = "multiple domain specification not allowed";
      local_118 = 0x29;
      local_110[0] = '\0';
      local_110[1] = '\0';
      local_110[2] = '\0';
      local_110[3] = '\0';
      local_110[4] = '\0';
      local_110[5] = '\0';
      local_110[6] = '\0';
      local_110[7] = '\0';
      local_100 = (code *)0x0;
      local_108 = paVar9;
      local_f8[0].handler_ = (format_string_checker<char> *)paVar9;
      do {
        cVar1 = *pcVar8;
        pcVar11 = pcVar8;
        while (cVar1 != '{') {
          pcVar11 = pcVar11 + 1;
          if (pcVar11 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(local_f8,pcVar8,"");
            goto LAB_0024d6b2;
          }
          cVar1 = *pcVar11;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(local_f8,pcVar8,pcVar11);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar11,"",(format_string_checker<char> *)paVar9);
      } while (pcVar8 != "");
LAB_0024d6b2:
      args_09.field_1.args_ = in_R9.args_;
      args_09.desc_ = (unsigned_long_long)(local_138 + 0x10);
      ::fmt::v10::vformat_abi_cxx11_
                (&local_198,(v10 *)"multiple domain specification not allowed",
                 (string_view)ZEXT816(0x29),args_09);
      local_178._0_4_ = 2;
      pcStack_170 = local_168._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pcStack_170,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
    }
    else {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_138 + 0x10);
      local_138._16_8_ = local_138._16_8_ & 0xffffffff00000000;
      pcVar8 = "--nwk and --dom are mutually exclusive";
      pcStack_120 = "--nwk and --dom are mutually exclusive";
      local_118 = 0x26;
      local_110[0] = '\0';
      local_110[1] = '\0';
      local_110[2] = '\0';
      local_110[3] = '\0';
      local_110[4] = '\0';
      local_110[5] = '\0';
      local_110[6] = '\0';
      local_110[7] = '\0';
      local_100 = (code *)0x0;
      local_108 = paVar9;
      local_f8[0].handler_ = (format_string_checker<char> *)paVar9;
      do {
        cVar1 = *pcVar8;
        pcVar11 = pcVar8;
        while (cVar1 != '{') {
          pcVar11 = pcVar11 + 1;
          if (pcVar11 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(local_f8,pcVar8,"");
            goto LAB_0024d2eb;
          }
          cVar1 = *pcVar11;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(local_f8,pcVar8,pcVar11);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar11,"",(format_string_checker<char> *)paVar9);
      } while (pcVar8 != "");
LAB_0024d2eb:
      args_04.field_1.args_ = in_R9.args_;
      args_04.desc_ = (unsigned_long_long)(local_138 + 0x10);
      ::fmt::v10::vformat_abi_cxx11_
                (&local_198,(v10 *)"--nwk and --dom are mutually exclusive",
                 (string_view)ZEXT816(0x26),args_04);
      local_178._0_4_ = 2;
      pcStack_170 = local_168._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pcStack_170,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
    }
    local_150 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_148,(string *)&pcStack_170);
    if (pcStack_170 != local_168._M_local_buf + 8) goto LAB_0024d1f9;
LAB_0024d1fe:
    _Var10._M_p = local_198._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_0024d214;
  }
  else {
    bVar5 = IsFeatureSupported((Interpreter *)__return_storage_ptr__,mMultiNetworkSyntax_abi_cxx11_,
                               aExpr);
    bVar13 = false;
    if ((((this->mContext).mImportFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->mContext).mImportFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) &&
        (pbVar12 = (this->mContext).mNwkAliases.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, bVar13 = false,
        (long)(this->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 == 0x20)) &&
       (iVar7 = std::__cxx11::string::compare((char *)pbVar12), iVar7 != 0)) {
      iVar7 = std::__cxx11::string::compare
                        ((char *)(this->mContext).mNwkAliases.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
      bVar13 = iVar7 != 0;
    }
    if (!bVar13 && !bVar5) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_138 + 0x10);
      local_138._16_4_ = 0xc;
      pcVar8 = "\'{}\' is not supported by the command";
      pcStack_120 = "\'{}\' is not supported by the command";
      local_118 = 0x24;
      local_110[0] = '\0';
      local_110[1] = '\0';
      local_110[2] = '\0';
      local_110[3] = '\0';
      local_110[4] = '\x01';
      local_110[5] = '\0';
      local_110[6] = '\0';
      local_110[7] = '\0';
      local_100 = ::fmt::v10::detail::
                  parse_format_specs<char[6],fmt::v10::detail::compile_parse_context<char>>;
      local_108 = paVar9;
      local_f8[0].handler_ = (format_string_checker<char> *)paVar9;
      do {
        cVar1 = *pcVar8;
        pcVar11 = pcVar8;
        while (cVar1 != '{') {
          pcVar11 = pcVar11 + 1;
          if (pcVar11 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>
            ::writer::operator()((writer *)local_f8,pcVar8,"");
            goto LAB_0024cd23;
          }
          cVar1 = *pcVar11;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_char[6]>_>::
        writer::operator()((writer *)local_f8,pcVar8,pcVar11);
        pcVar8 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,char[6]>&>
                           (pcVar11,"",(format_string_checker<char> *)paVar9);
      } while (pcVar8 != "");
LAB_0024cd23:
      local_138._16_8_ = (long)"start --nwk" + 6;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)(local_138 + 0x10);
      fmt.size_ = 0xc;
      fmt.data_ = (char *)0x24;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_198,(v10 *)"\'{}\' is not supported by the command",fmt,args_00);
      local_178._0_4_ = 2;
      pcStack_170 = local_168._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pcStack_170,local_198._M_dataplus._M_p,
                 local_198._M_dataplus._M_p + local_198._M_string_length);
LAB_0024d1d5:
      local_150 = local_178._0_4_;
      std::__cxx11::string::operator=((string *)&local_148,(string *)&pcStack_170);
      if (pcStack_170 != local_168._M_local_buf + 8) {
LAB_0024d1f9:
        operator_delete(pcStack_170);
      }
      goto LAB_0024d1fe;
    }
    local_e0 = __return_storage_ptr__;
    if ((this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->mContext).mDomAliases.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pbVar12 = (this->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (this->mContext).mNwkAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d8 = aNids;
      if (pbVar12 != pbVar2) {
LAB_0024cd9e:
        iVar7 = std::__cxx11::string::compare((char *)pbVar12);
        if (((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)pbVar12), iVar7 != 0))
           || ((long)(this->mContext).mNwkAliases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mContext).mNwkAliases.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 0x20)) goto LAB_0024cdcf;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_138 + 0x10);
        local_138._16_4_ = 0xd;
        pcVar8 = "\'{}\' must not combine with any other network alias";
        pcStack_120 = "\'{}\' must not combine with any other network alias";
        local_118 = 0x32;
        local_110[0] = '\0';
        local_110[1] = '\0';
        local_110[2] = '\0';
        local_110[3] = '\0';
        local_110[4] = '\x01';
        local_110[5] = '\0';
        local_110[6] = '\0';
        local_110[7] = '\0';
        local_100 = ::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_108 = paVar9;
        local_f8[0].handler_ = (format_string_checker<char> *)paVar9;
        do {
          cVar1 = *pcVar8;
          pcVar11 = pcVar8;
          while (cVar1 != '{') {
            pcVar11 = pcVar11 + 1;
            if (pcVar11 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()((writer *)local_f8,pcVar8,"");
              goto LAB_0024d51e;
            }
            cVar1 = *pcVar11;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)local_f8,pcVar8,pcVar11);
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar11,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)paVar9);
        } while (pcVar8 != "");
LAB_0024d51e:
        local_138._16_8_ = (pbVar12->_M_dataplus)._M_p;
        pcStack_120 = (char *)pbVar12->_M_string_length;
        args_07.field_1.args_ = in_R9.args_;
        args_07.desc_ = (unsigned_long_long)(local_138 + 0x10);
        fmt_02.size_ = 0xd;
        fmt_02.data_ = (char *)0x32;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_198,(v10 *)"\'{}\' must not combine with any other network alias",fmt_02,
                   args_07);
        local_178._0_4_ = 2;
        pcStack_170 = local_168._M_local_buf + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_170,local_198._M_dataplus._M_p,
                   local_198._M_dataplus._M_p + local_198._M_string_length);
        goto LAB_0024ccc4;
      }
LAB_0024cdd8:
      local_198._M_dataplus._M_p = (pointer)0x0;
      local_198._M_string_length = 0;
      local_198.field_2._M_allocated_capacity = 0;
      SVar6 = persistent_storage::Registry::GetNetworkXpansByAliases
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(StringArray *)this,local_d8,(StringArray *)&local_198);
      sVar4 = local_198._M_string_length;
      if (local_198._M_dataplus._M_p != (pointer)local_198._M_string_length) {
        local_c8 = (ulong)SVar6;
        local_d0 = (ulong)SVar6 << 2;
        _Var10._M_p = local_198._M_dataplus._M_p;
        do {
          local_138._16_8_ = &local_118;
          pcStack_120 = (char *)0x0;
          local_118 = local_118 & 0xffffffffffffff00;
          pcVar8 = "failed to resolve";
          if (SVar6 < kError) {
            pcVar8 = &DAT_002f5f1c + *(int *)(&DAT_002f5f1c + local_d0);
          }
          std::__cxx11::string::_M_replace((ulong)(local_138 + 0x10),0,(char *)0x0,(ulong)pcVar8);
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c0,*(size_type *)_Var10._M_p,
                     (((parse_context_type *)(_Var10._M_p + 8))->
                     super_basic_format_parse_context<char>).format_str_.data_ +
                     *(size_type *)_Var10._M_p);
          this_00 = (Interpreter *)local_a0;
          local_a0._0_8_ = (pointer)(local_a0 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,local_138._16_8_,
                     (char *)((long)pcStack_120 + local_138._16_8_));
          PrintNetworkMessage(this_00,&local_c0,(string *)local_a0,kYellow);
          if ((pointer)local_a0._0_8_ != (pointer)(local_a0 + 0x10)) {
            operator_delete((void *)local_a0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p);
          }
          if ((ulong *)local_138._16_8_ != &local_118) {
            operator_delete((void *)local_138._16_8_);
          }
          _Var10._M_p = _Var10._M_p + 0x20;
        } while (_Var10._M_p != (pointer)sVar4);
      }
      aNids = local_d8;
      __return_storage_ptr__ = local_e0;
      if ((local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (local_d8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_06.field_1.values_ = in_R9.values_;
        args_06.desc_ = (unsigned_long_long)local_f8;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_178,
                   (v10 *)"specified alias(es) resolved to an empty list of networks",
                   (string_view)ZEXT816(0x39),args_06);
        local_138._16_4_ = 0x12;
        pcStack_120 = local_110;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_120,local_178,pcStack_170 + (long)local_178);
      }
      else {
        if (SVar6 == kSuccess) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_198);
LAB_0024d57c:
          if ((aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish !=
              (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start) goto LAB_0024d214;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          args_08.field_1.args_ = in_R9.args_;
          args_08.desc_ = (unsigned_long_long)&local_198;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)local_178,
                     (v10 *)"specified alias(es) resolved to an empty list of networks",
                     (string_view)ZEXT816(0x39),args_08);
          local_138._16_4_ = 2;
          pcStack_120 = local_110;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pcStack_120,local_178,pcStack_170 + (long)local_178);
          local_150 = local_138._16_4_;
          std::__cxx11::string::operator=((string *)&local_148,(string *)&pcStack_120);
          if (pcStack_120 != local_110) {
            operator_delete(pcStack_120);
          }
          _Var10._M_p = (pointer)local_178;
          if (local_178 == (undefined1  [8])&local_168) goto LAB_0024d214;
          goto LAB_0024d20f;
        }
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_f8;
        ::fmt::v10::vformat_abi_cxx11_
                  ((string *)local_178,(v10 *)"failed to resolve",(string_view)ZEXT816(0x11),args_01
                  );
        local_138._16_4_ = 0x12;
        pcStack_120 = local_110;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pcStack_120,local_178,pcStack_170 + (long)local_178);
      }
      local_150 = local_138._16_4_;
      std::__cxx11::string::operator=((string *)&local_148,(string *)&pcStack_120);
      if (pcStack_120 != local_110) {
        operator_delete(pcStack_120);
      }
      __return_storage_ptr__ = local_e0;
      if (local_178 != (undefined1  [8])&local_168) {
        operator_delete((void *)local_178);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_198);
      goto LAB_0024d214;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_138 + 0x10);
    local_138._16_8_ = (ulong)(uint)local_138._20_4_ << 0x20;
    pcVar8 = "--nwk and --dom are mutually exclusive";
    pcStack_120 = "--nwk and --dom are mutually exclusive";
    local_118 = 0x26;
    local_110[0] = '\0';
    local_110[1] = '\0';
    local_110[2] = '\0';
    local_110[3] = '\0';
    local_110[4] = '\0';
    local_110[5] = '\0';
    local_110[6] = '\0';
    local_110[7] = '\0';
    local_100 = (code *)0x0;
    local_108 = paVar9;
    local_f8[0].handler_ = (format_string_checker<char> *)paVar9;
    do {
      cVar1 = *pcVar8;
      pcVar11 = pcVar8;
      while (cVar1 != '{') {
        pcVar11 = pcVar11 + 1;
        if (pcVar11 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(local_f8,pcVar8,"");
          goto LAB_0024cc7f;
        }
        cVar1 = *pcVar11;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(local_f8,pcVar8,pcVar11);
      pcVar8 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar11,"",(format_string_checker<char> *)paVar9);
    } while (pcVar8 != "");
LAB_0024cc7f:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)(local_138 + 0x10);
    ::fmt::v10::vformat_abi_cxx11_
              (&local_198,(v10 *)"--nwk and --dom are mutually exclusive",(string_view)ZEXT816(0x26)
               ,args);
    local_178._0_4_ = 2;
    pcStack_170 = local_168._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pcStack_170,local_198._M_dataplus._M_p,
               local_198._M_dataplus._M_p + local_198._M_string_length);
LAB_0024ccc4:
    local_150 = local_178._0_4_;
    std::__cxx11::string::operator=((string *)&local_148,(string *)&pcStack_170);
    if (pcStack_170 != local_168._M_local_buf + 8) {
      operator_delete(pcStack_170);
    }
    _Var10._M_p = local_198._M_dataplus._M_p;
    __return_storage_ptr__ = local_e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p == &local_198.field_2) goto LAB_0024d214;
  }
LAB_0024d20f:
  operator_delete(_Var10._M_p);
LAB_0024d214:
  pbVar12 = local_140;
  local_80 = local_150;
  if (local_148 == (pointer)local_138) {
    local_68._8_4_ = local_138._8_4_;
    local_68._12_4_ = local_138._12_4_;
    local_148 = (pointer)local_68;
  }
  local_68._4_4_ = local_138._4_4_;
  local_68._0_4_ = local_138._0_4_;
  local_70 = local_140;
  local_140 = (pointer)0x0;
  local_138._0_4_ = local_138._0_4_ & 0xffffff00;
  (__return_storage_ptr__->mError).mCode = local_150;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  p_Var3 = &local_148->_M_dataplus;
  local_78 = local_148;
  local_148 = (pointer)local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__return_storage_ptr__->mError).mMessage,local_78,
             (undefined1 *)((long)&(pbVar12->_M_dataplus)._M_p + (long)&p_Var3->_M_p));
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  if (local_78 != (pointer)local_68) {
    operator_delete(local_78);
  }
  if (local_148 != (pointer)local_138) {
    operator_delete(local_148);
  }
  return __return_storage_ptr__;
LAB_0024cdcf:
  pbVar12 = pbVar12 + 1;
  if (pbVar12 == pbVar2) goto LAB_0024cdd8;
  goto LAB_0024cd9e;
}

Assistant:

Interpreter::Value Interpreter::ValidateMultiNetworkSyntax(const Expression &aExpr, std::vector<uint64_t> &aNids)
{
    Error error;
    bool  supported;

    if (mContext.mNwkAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        // MN-syntax is also supported for import from multi-entry JSON
        supported |= mContext.mImportFiles.size() > 0 && mContext.mNwkAliases.size() == 1 &&
                     mContext.mNwkAliases[0] != ALIAS_ALL && mContext.mNwkAliases[0] != ALIAS_OTHERS;
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_NETWORK));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mDomAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // validate group alias usage; if used, it must be alone
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
            {
                VerifyOrExit(mContext.mNwkAliases.size() == 1, error = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
            }
        }
        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, aNids, unresolved);
        for (const auto &alias : unresolved)
        {
            std::string errorMessage;
            switch (status)
            {
            case RegistryStatus::kAmbiguity:
                errorMessage = "alias ambiguous";
                break;
            case RegistryStatus::kSuccess:  // partially successful resolution
            case RegistryStatus::kNotFound: // failed to find any
                errorMessage = "alias not found";
                break;
            default:
                errorMessage = RUNTIME_RESOLVING_FAILED;
            }
            PrintNetworkMessage(alias, errorMessage, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(aNids.size() > 0, error = ERROR_REGISTRY_ERROR(RUNTIME_EMPTY_NIDS));
        VerifyOrExit(status == RegistryStatus::kSuccess, error = ERROR_REGISTRY_ERROR(RUNTIME_RESOLVING_FAILED));
    }
    else if (mContext.mDomAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_DOMAIN));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mNwkAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // domain must be single
        VerifyOrExit(mContext.mDomAliases.size() < 2, error = ERROR_INVALID_ARGS(SYNTAX_MULTI_DOMAIN));
        RegistryStatus status = mRegistry->GetNetworkXpansInDomain(mContext.mDomAliases.front(), aNids);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     error = status == RegistryStatus::kNotFound
                                 ? ERROR_REGISTRY_ERROR("domain '{}' not found", mContext.mDomAliases[0])
                                 : ERROR_REGISTRY_ERROR("domain '{}' failed to resolve with status={}",
                                                        mContext.mDomAliases.front(), static_cast<int>(status)));
    }
    else
    {
        // as we came here to evaluate multi-network command, either
        // network or domain list must have entries
        VerifyOrExit(false,
                     ERROR_INVALID_ARGS(
                         "Either network or domain list must have entries for multi-network command")); // must not hit
                                                                                                        // this, ever
    }

    VerifyOrExit(aNids.size() > 0, error = ERROR_INVALID_ARGS(RUNTIME_EMPTY_NIDS));
exit:
    return error;
}